

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketData.h
# Opt level: O3

void __thiscall uWS::WebSocketData::~WebSocketData(WebSocketData *this)

{
  DeflationStream *pDVar1;
  Subscriber *pSVar2;
  Subscriber *pSVar3;
  pointer pcVar4;
  Subscriber *pSVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  
  pDVar1 = this->deflationStream;
  if (pDVar1 != (DeflationStream *)0x0) {
    deflateEnd(pDVar1);
    operator_delete(pDVar1,0x70);
  }
  pSVar2 = this->subscriber;
  if (pSVar2 != (Subscriber *)0x0) {
    pSVar5 = *(Subscriber **)pSVar2;
    while (pSVar5 != pSVar2) {
      pSVar3 = *(Subscriber **)pSVar5;
      operator_delete(pSVar5,0x18);
      pSVar5 = pSVar3;
    }
    operator_delete(pSVar2,0x20);
  }
  pcVar4 = (this->fragmentBuffer)._M_dataplus._M_p;
  paVar6 = &(this->fragmentBuffer).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar6) {
    operator_delete(pcVar4,paVar6->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->super_AsyncSocketData<false>).buffer._M_dataplus._M_p;
  paVar6 = &(this->super_AsyncSocketData<false>).buffer.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar6) {
    return;
  }
  operator_delete(pcVar4,paVar6->_M_allocated_capacity + 1);
  return;
}

Assistant:

~WebSocketData() {
        if (deflationStream) {
            delete deflationStream;
        }

        if (subscriber) {
            delete subscriber;
        }
    }